

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.hpp
# Opt level: O0

bool CoreML::Specification::operator==
               (Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *a,Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *b)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  _Rb_tree_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *__lhs;
  const_iterator local_90;
  const_iterator local_78;
  const_reference local_60;
  value_type *pair;
  const_iterator __end0;
  const_iterator __begin0;
  Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *b_local;
  Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *a_local;
  
  sVar2 = google::protobuf::
          Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(a);
  sVar3 = google::protobuf::
          Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(b);
  if (sVar2 == sVar3) {
    google::protobuf::
    Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    begin((const_iterator *)&__end0.it_.bucket_index_,a);
    google::protobuf::
    Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::end
              ((const_iterator *)&pair,a);
    while (bVar1 = google::protobuf::operator!=
                             ((const_iterator *)&__end0.it_.bucket_index_,(const_iterator *)&pair),
          bVar1) {
      local_60 = google::protobuf::
                 Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::const_iterator::operator*((const_iterator *)&__end0.it_.bucket_index_);
      google::protobuf::
      Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      find(&local_78,b,&local_60->first);
      google::protobuf::
      Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      end(&local_90,b);
      bVar1 = google::protobuf::operator==(&local_78,&local_90);
      if (bVar1) {
        return false;
      }
      __lhs = (_Rb_tree_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
               *)google::protobuf::
                 Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::at(b,&local_60->first);
      bVar1 = std::operator!=(__lhs,(_Rb_tree_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                     *)&local_60->second);
      if (bVar1) {
        return false;
      }
      google::protobuf::
      Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      const_iterator::operator++((const_iterator *)&__end0.it_.bucket_index_);
    }
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const ::google::protobuf::Map<T,U>& a,
                        const ::google::protobuf::Map<T,U>& b) {
            if (a.size() != b.size()) {
                return false;
            }
            for (const auto& pair : a) {
                if (b.find(pair.first) == b.end()) {
                    return false;
                }
                if (b.at(pair.first) != pair.second) {
                    return false;
                }
            }
            return true;
        }